

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseConstValue
          (JSONParser *this,Type type,Value *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  string_view value_str_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view value_str_01;
  string_view value_str_02;
  string_view value_str_03;
  string_view value_str_04;
  ExpectedNan *pEVar1;
  bool bVar2;
  Enum EVar3;
  undefined8 uVar4;
  float val;
  double val_00;
  string local_148;
  Ref local_128;
  JSONParser *local_120;
  size_t local_118;
  Enum local_110;
  uint32_t local_10c;
  size_t sStack_108;
  uint32_t value_2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_100;
  JSONParser *local_f0;
  char *local_e8;
  Ref local_e0;
  size_t local_d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_d0;
  JSONParser *local_c0;
  char *local_b8;
  JSONParser *local_b0;
  size_t local_a8;
  Enum local_9c;
  uint64_t local_98;
  uint64_t value_bits_1;
  size_t local_88;
  Enum local_7c;
  u64 local_78;
  uint64_t value_1;
  size_t local_68;
  Enum local_60;
  uint32_t local_5c;
  JSONParser *pJStack_58;
  uint32_t value_bits;
  size_t local_50;
  Enum local_48;
  u32 local_44;
  ExpectedNan *pEStack_40;
  uint32_t value;
  ExpectedNan *out_nan_local;
  Value *out_value_local;
  JSONParser *this_local;
  string_view value_str_local;
  Type type_local;
  
  value_str_local._M_len = (size_t)value_str._M_str;
  this_local = (JSONParser *)value_str._M_len;
  *out_nan = None;
  pEStack_40 = out_nan;
  out_nan_local = (ExpectedNan *)out_value;
  out_value_local = (Value *)this;
  unique0x1000053a = type;
  EVar3 = wabt::Type::operator_cast_to_Enum((Type *)((long)&value_str_local._M_str + 4));
  switch(EVar3) {
  case ExternRef:
    local_f0 = this_local;
    local_e8 = (char *)value_str_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"null");
    __x._M_str = local_e8;
    __x._M_len = (size_t)local_f0;
    bVar2 = std::operator==(__x,local_100);
    if (bVar2) {
      sStack_108 = wabt::interp::Ref::Null.index;
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)out_nan_local,wabt::interp::Ref::Null);
    }
    else {
      local_120 = this_local;
      local_118 = value_str_local._M_len;
      value_str_00._M_str = (char *)value_str_local._M_len;
      value_str_00._M_len = (size_t)this_local;
      local_110 = (Enum)ParseI32Value(this,&local_10c,value_str_00);
      bVar2 = wabt::Failed((Result)local_110);
      pEVar1 = out_nan_local;
      if (bVar2) {
        wabt::Result::Result((Result *)&type_local,Error);
        return (Result)type_local.enum_;
      }
      wabt::interp::Ref::Ref(&local_128,(ulong)(local_10c + 1));
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)pEVar1,local_128);
    }
    break;
  case FuncRef:
    local_c0 = this_local;
    local_b8 = (char *)value_str_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"null");
    __x_00._M_str = local_b8;
    __x_00._M_len = (size_t)local_c0;
    bVar2 = std::operator==(__x_00,local_d0);
    pEVar1 = out_nan_local;
    if (bVar2) {
      local_d8 = wabt::interp::Ref::Null.index;
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)out_nan_local,wabt::interp::Ref::Null);
    }
    else {
      if (allow_expected != Yes) {
        __assert_fail("allow_expected == AllowExpected::Yes",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                      ,0x32d,
                      "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, std::string_view, AllowExpected)"
                     );
      }
      wabt::interp::Ref::Ref(&local_e0,1);
      wabt::interp::Value::Set<wabt::interp::Ref>((Value *)pEVar1,local_e0);
    }
    break;
  default:
    wabt::Type::GetName_abi_cxx11_(&local_148,(Type *)((long)&value_str_local._M_str + 4));
    uVar4 = std::__cxx11::string::c_str();
    PrintError(this,"unknown concrete type: \"%s\"",uVar4);
    std::__cxx11::string::~string((string *)&local_148);
    wabt::Result::Result((Result *)&type_local,Error);
    return (Result)type_local.enum_;
  case V128:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                  ,0x326,
                  "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, std::string_view, AllowExpected)"
                 );
  case F64:
    local_b0 = this_local;
    local_a8 = value_str_local._M_len;
    value_str_01._M_str = (char *)value_str_local._M_len;
    value_str_01._M_len = (size_t)this_local;
    local_9c = (Enum)ParseF64Value(this,&local_98,pEStack_40,value_str_01,allow_expected);
    bVar2 = wabt::Failed((Result)local_9c);
    pEVar1 = out_nan_local;
    if (bVar2) {
      wabt::Result::Result((Result *)&type_local,Error);
      return (Result)type_local.enum_;
    }
    val_00 = wabt::Bitcast<double,unsigned_long&>(&local_98);
    wabt::interp::Value::Set<double>((Value *)pEVar1,(f64)val_00);
    break;
  case F32:
    value_1 = (uint64_t)this_local;
    local_68 = value_str_local._M_len;
    value_str_03._M_str = (char *)value_str_local._M_len;
    value_str_03._M_len = (size_t)this_local;
    local_60 = (Enum)ParseF32Value(this,&local_5c,pEStack_40,value_str_03,allow_expected);
    bVar2 = wabt::Failed((Result)local_60);
    pEVar1 = out_nan_local;
    if (bVar2) {
      wabt::Result::Result((Result *)&type_local,Error);
      return (Result)type_local.enum_;
    }
    val = wabt::Bitcast<float,unsigned_int&>(&local_5c);
    wabt::interp::Value::Set<float>((Value *)pEVar1,(f32)val);
    break;
  case I64:
    value_bits_1 = (uint64_t)this_local;
    local_88 = value_str_local._M_len;
    value_str_02._M_str = (char *)value_str_local._M_len;
    value_str_02._M_len = (size_t)this_local;
    local_7c = (Enum)ParseI64Value(this,&local_78,value_str_02);
    bVar2 = wabt::Failed((Result)local_7c);
    if (bVar2) {
      wabt::Result::Result((Result *)&type_local,Error);
      return (Result)type_local.enum_;
    }
    wabt::interp::Value::Set<unsigned_long>((Value *)out_nan_local,local_78);
    break;
  case I32:
    pJStack_58 = this_local;
    local_50 = value_str_local._M_len;
    value_str_04._M_str = (char *)value_str_local._M_len;
    value_str_04._M_len = (size_t)this_local;
    local_48 = (Enum)ParseI32Value(this,&local_44,value_str_04);
    bVar2 = wabt::Failed((Result)local_48);
    if (bVar2) {
      wabt::Result::Result((Result *)&type_local,Error);
      return (Result)type_local.enum_;
    }
    wabt::interp::Value::Set<unsigned_int>((Value *)out_nan_local,local_44);
  }
  wabt::Result::Result((Result *)&type_local,Ok);
  return (Result)type_local.enum_;
}

Assistant:

wabt::Result JSONParser::ParseConstValue(Type type,
                                         Value* out_value,
                                         ExpectedNan* out_nan,
                                         std::string_view value_str,
                                         AllowExpected allow_expected) {
  *out_nan = ExpectedNan::None;

  switch (type) {
    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F32: {
      uint32_t value_bits;
      CHECK_RESULT(
          ParseF32Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f32>(value_bits));
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F64: {
      uint64_t value_bits;
      CHECK_RESULT(
          ParseF64Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f64>(value_bits));
      break;
    }

    case Type::V128:
      assert(false);  // Should use ParseLaneConstValue instead.
      break;

    case Type::FuncRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        assert(allow_expected == AllowExpected::Yes);
        out_value->Set(Ref{1});
      }
      break;

    case Type::ExternRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        uint32_t value;
        CHECK_RESULT(ParseI32Value(&value, value_str));
        // TODO: hack, just whatever ref is at this index; but skip null (which
        // is always 0).
        out_value->Set(Ref{value + 1});
      }
      break;

    default:
      PrintError("unknown concrete type: \"%s\"", type.GetName().c_str());
      return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}